

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateVerilogNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  Cba_Man_t *pCVar1;
  void *__ptr;
  int *piVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  Vec_Ptr_t *__ptr_00;
  ulong uVar15;
  char *pcVar16;
  size_t sVar17;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  int Fill_05;
  int Fill_06;
  int Fill_07;
  int Fill_08;
  int Fill_09;
  int Fill_10;
  int Fill_11;
  int Fill_12;
  int Fill_13;
  int Fill_14;
  int Fill_15;
  int Fill_16;
  int Fill_17;
  int Fill_18;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar18;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  int *extraout_RDX_10;
  int *extraout_RDX_11;
  int *extraout_RDX_12;
  int *piVar19;
  int *extraout_RDX_13;
  int *extraout_RDX_14;
  int *extraout_RDX_15;
  int *extraout_RDX_16;
  Prs_Ntk_t *pNtk_00;
  Prs_Ntk_t *extraout_RDX_17;
  Prs_Ntk_t *pPVar20;
  ulong extraout_RDX_18;
  Prs_Ntk_t *pNtk_01;
  ulong uVar21;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 uVar22;
  long lVar23;
  Cba_ObjType_t CVar24;
  ulong uVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  Prs_VerInfo_t *pPVar29;
  char **ppcVar30;
  int iBitRst;
  int iBitSet;
  int IndexRst;
  int IndexSet;
  ulong local_b0;
  void *local_90;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  long local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  iVar10 = (pNtk->vObjs).nSize;
  piVar14 = (int *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar11 = iVar10;
  }
  *piVar14 = iVar11;
  local_48 = (long)iVar10;
  if (iVar11 == 0) {
    piVar14[2] = 0;
    piVar14[3] = 0;
    piVar14[1] = iVar10;
    lVar18 = extraout_RDX;
LAB_003e5417:
    local_90 = (void *)0x0;
  }
  else {
    local_90 = malloc((long)iVar11 << 2);
    *(void **)(piVar14 + 2) = local_90;
    piVar14[1] = iVar10;
    lVar18 = extraout_RDX_00;
    if (local_90 == (void *)0x0) goto LAB_003e5417;
    memset(local_90,0,local_48 * 4);
    lVar18 = extraout_RDX_01;
  }
  pCVar1 = p->pDesign;
  if (0 < (pCVar1->vUsed).nSize) {
    piVar19 = (pCVar1->vUsed).pArray;
    lVar18 = 0;
    do {
      iVar11 = piVar19[lVar18];
      if (((long)iVar11 < 0) || ((pCVar1->vNameMap).nSize <= iVar11)) goto LAB_003e73f5;
      (pCVar1->vNameMap).pArray[iVar11] = 0;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pCVar1->vUsed).nSize);
  }
  (pCVar1->vUsed).nSize = 0;
  if (0 < (p->vInputs).nSize) {
    lVar28 = 0;
    do {
      iVar11 = (p->vInputs).pArray[lVar28];
      lVar23 = (long)iVar11;
      if (lVar23 < 1) goto LAB_003e7515;
      if ((p->vObjName).nSize < 1) goto LAB_003e750c;
      Vec_IntFillExtra(&p->vObjName,iVar11 + 1,(int)lVar18);
      if (((p->vObjName).nSize <= iVar11) || ((p->vObjFon0).nSize <= iVar11)) goto LAB_003e73d6;
      uVar6 = (p->vObjName).pArray[lVar23];
      pCVar1 = p->pDesign;
      iVar11 = (p->vObjFon0).pArray[lVar23];
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill);
      if (((int)uVar6 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar6)) goto LAB_003e73d6;
      if ((pCVar1->vNameMap).pArray[uVar6] != 0) goto LAB_003e7471;
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill_00);
      if ((pCVar1->vNameMap).nSize <= (int)uVar6) goto LAB_003e73f5;
      (pCVar1->vNameMap).pArray[uVar6] = iVar11;
      Vec_IntPush(&pCVar1->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_02;
    } while (lVar28 < (p->vInputs).nSize);
  }
  if (0 < (pNtk->vWires).nSize) {
    lVar28 = 0;
    do {
      if ((pNtk->vWiresR).nSize <= lVar28) goto LAB_003e73d6;
      iVar11 = (pNtk->vWiresR).pArray[lVar28];
      uVar6 = (pNtk->vWires).pArray[lVar28];
      pCVar1 = p->pDesign;
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,(int)lVar18);
      if (((int)uVar6 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar6)) goto LAB_003e73d6;
      if ((pCVar1->vNameMap).pArray[uVar6] != 0) goto LAB_003e7471;
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill_01);
      if ((pCVar1->vNameMap).nSize <= (int)uVar6) goto LAB_003e73f5;
      (pCVar1->vNameMap).pArray[uVar6] = -iVar11;
      Vec_IntPush(&pCVar1->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_03;
    } while (lVar28 < (pNtk->vWires).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar28 = 0;
    do {
      if ((pNtk->vOutputsR).nSize <= lVar28) goto LAB_003e73d6;
      iVar11 = (pNtk->vOutputsR).pArray[lVar28];
      uVar6 = (pNtk->vOutputs).pArray[lVar28];
      pCVar1 = p->pDesign;
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,(int)lVar18);
      if (((int)uVar6 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar6)) goto LAB_003e73d6;
      if ((pCVar1->vNameMap).pArray[uVar6] != 0) {
LAB_003e7471:
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill_02);
      if ((pCVar1->vNameMap).nSize <= (int)uVar6) goto LAB_003e73f5;
      (pCVar1->vNameMap).pArray[uVar6] = -iVar11;
      Vec_IntPush(&pCVar1->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_04;
    } while (lVar28 < (pNtk->vOutputs).nSize);
  }
  __ptr_00 = Prs_CreateDetectRams(pNtk);
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr_00->nSize) {
      local_58 = &p->vFonRange;
      lVar18 = 0;
      local_40 = __ptr_00;
      do {
        pvVar26 = local_40->pArray[lVar18];
        if ((*(int *)((long)pvVar26 + 4) < 1) ||
           (local_38 = lVar18, *(int *)((long)pvVar26 + 4) == 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pcVar16 = (char *)**(undefined8 **)((long)pvVar26 + 8);
        iVar11 = *(int *)(*(undefined8 **)((long)pvVar26 + 8) + 1);
        iVar5 = Cba_NtkNewStrId(p,"%s_box");
        uVar6 = Cba_ObjAlloc(p,CBA_BOX_RAMBOX,*(int *)((long)pvVar26 + 4) + -2,1);
        Cba_ObjSetName(p,uVar6,iVar5);
        if ((int)uVar6 < 1) goto LAB_003e7490;
        if ((p->vObjFon0).nSize <= (int)uVar6) goto LAB_003e73d6;
        local_50 = (Vec_Int_t *)(ulong)uVar6;
        iVar5 = (p->vObjFon0).pArray[(long)local_50];
        iVar7 = Cba_NtkNewStrId(p,pcVar16);
        Cba_FonSetName(p,iVar5,iVar7);
        Prs_CreateRange(p,iVar5,iVar7);
        iVar7 = Cba_FonLeft(p,iVar5);
        if (iVar11 <= iVar7) {
          __assert_fail("Cba_FonLeft(p, iFon) <= MemSize-1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x737,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        iVar5 = Cba_FonRight(p,iVar5);
        if (iVar5 != 0) {
          __assert_fail("Cba_FonRight(p, iFon) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x738,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        if (2 < *(int *)((long)pvVar26 + 4)) {
          uVar25 = 0;
          do {
            __ptr = *(void **)(*(long *)((long)pvVar26 + 8) + 0x10 + uVar25 * 8);
            uVar8 = Cba_ObjAlloc(p,CBA_BOX_RAMWC,4,1);
            if (*(int *)((long)__ptr + 4) < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            uVar9 = *(int *)((long)__ptr + 4) - 1;
            *(uint *)((long)__ptr + 4) = uVar9;
            iVar5 = *(int *)(*(long *)((long)__ptr + 8) + (ulong)uVar9 * 4);
            lVar18 = (long)iVar5;
            if ((lVar18 < 0) || (iVar10 <= iVar5)) goto LAB_003e73f5;
            *(uint *)((long)local_90 + lVar18 * 4) = uVar8;
            if (((pNtk->vObjs).nSize <= iVar5) ||
               ((iVar5 = (pNtk->vObjs).pArray[lVar18], iVar5 < -2 ||
                (uVar9 = iVar5 + 2, (pNtk->vBoxes).nSize <= (int)uVar9)))) goto LAB_003e73d6;
            iVar5 = (pNtk->vBoxes).pArray[uVar9];
            if (iVar5 != 0) {
              Cba_ObjSetName(p,uVar8,iVar5);
            }
            if ((int)uVar8 < 1) goto LAB_003e7490;
            if ((p->vObjFon0).nSize <= (int)uVar8) goto LAB_003e73d6;
            piVar19 = (p->vObjFon0).pArray;
            uVar8 = piVar19[uVar8];
            iVar5 = Hash_Int2ManInsert(p->pDesign->vHash,iVar11 + -1,0,(int)piVar19);
            if ((p->vFonRange).nSize < 1) goto LAB_003e74af;
            if (iVar5 < 0) goto LAB_003e74ce;
            Vec_IntFillExtra(local_58,uVar8 + 1,Fill_03);
            if (((int)uVar8 < 0) || ((p->vFonRange).nSize <= (int)uVar8)) goto LAB_003e73f5;
            (p->vFonRange).pArray[uVar8] = iVar5 * 2;
            uVar9 = Cba_NtkNewStrId(p,"%s_wp%d",pcVar16,uVar25 & 0xffffffff);
            Cba_FonSetName(p,uVar8,uVar9);
            pCVar1 = p->pDesign;
            Vec_IntFillExtra(&pCVar1->vNameMap,uVar9 + 1,Fill_04);
            if (((int)uVar9 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar9)) goto LAB_003e73d6;
            if ((pCVar1->vNameMap).pArray[uVar9] != 0) goto LAB_003e7471;
            Vec_IntFillExtra(&pCVar1->vNameMap,uVar9 + 1,Fill_05);
            if ((pCVar1->vNameMap).nSize <= (int)uVar9) goto LAB_003e73f5;
            (pCVar1->vNameMap).pArray[uVar9] = uVar8;
            Vec_IntPush(&pCVar1->vUsed,uVar9);
            if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
            uVar15 = (uint)(p->vObjFin0).pArray[(long)local_50] + uVar25;
            iVar5 = (int)uVar15;
            if (iVar5 < 1) goto LAB_003e7414;
            if ((p->vFinFon).nSize <= iVar5) goto LAB_003e73d6;
            piVar19 = (p->vFinFon).pArray;
            uVar15 = uVar15 & 0xffffffff;
            if (piVar19[uVar15] != 0) goto LAB_003e7433;
            piVar19[uVar15] = uVar8;
            if (*(void **)((long)__ptr + 8) != (void *)0x0) {
              free(*(void **)((long)__ptr + 8));
            }
            free(__ptr);
            iVar5 = (int)uVar25;
            uVar25 = uVar25 + 2;
          } while (iVar5 + 4 < *(int *)((long)pvVar26 + 4));
        }
        if (*(void **)((long)pvVar26 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar26 + 8));
        }
        free(pvVar26);
        lVar18 = local_38 + 1;
        __ptr_00 = local_40;
      } while (lVar18 < local_40->nSize);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
  }
  (p->vArray0).nSize = 0;
  if ((pNtk->vObjs).nSize < 1) {
LAB_003e720b:
    if (local_90 != (void *)0x0) {
      free(local_90);
    }
    free(piVar14);
    if (0 < (pNtk->vOutputs).nSize) {
      lVar18 = 0;
      uVar22 = extraout_RDX_19;
      do {
        if (((pNtk->vOutputsR).nSize <= lVar18) || ((p->vOutputs).nSize <= lVar18)) {
LAB_003e73d6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = (p->vOutputs).pArray[lVar18];
        lVar28 = (long)iVar10;
        if (lVar28 < 1) goto LAB_003e7515;
        if ((p->vObjName).nSize < 1) goto LAB_003e750c;
        iVar11 = (pNtk->vOutputs).pArray[lVar18];
        iVar5 = (pNtk->vOutputsR).pArray[lVar18];
        Vec_IntFillExtra(&p->vObjName,iVar10 + 1,(int)uVar22);
        if ((p->vObjName).nSize <= iVar10) goto LAB_003e73d6;
        if (iVar11 != (p->vObjName).pArray[lVar28]) {
          __assert_fail("NameId == Cba_ObjName(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x83e,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        iVar11 = Prs_CreateVerilogFindFon(p,iVar11);
        uVar22 = extraout_RDX_20;
        if (iVar11 != 0) {
          if ((p->vObjFin0).nSize <= iVar10) goto LAB_003e73d6;
          iVar10 = (p->vObjFin0).pArray[lVar28];
          lVar28 = (long)iVar10;
          if (lVar28 < 1) {
LAB_003e7414:
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          if ((p->vFinFon).nSize <= iVar10) goto LAB_003e73d6;
          piVar14 = (p->vFinFon).pArray;
          if (piVar14[lVar28] != 0) {
LAB_003e7433:
            pcVar16 = "Cba_ObjFinFon(p, i, k)== 0";
LAB_003e743a:
            __assert_fail(pcVar16,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
          }
          piVar14[lVar28] = iVar11;
          if (iVar5 != 0) {
            if (iVar5 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (iVar5 == 1) {
              iVar5 = Cba_FonLeft(p,iVar11);
              iVar10 = 0;
              if (iVar5 != 0) {
LAB_003e769e:
                __assert_fail("Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId)) == Cba_FonLeft(p, iFon)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x845,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
              }
            }
            else {
              pVVar4 = p->pDesign->vHash->vObjs;
              uVar6 = iVar5 * 2 & 0x7ffffffc;
              if (pVVar4->nSize <= (int)uVar6) {
LAB_003e759d:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              iVar10 = pVVar4->pArray[uVar6];
              iVar5 = Cba_FonLeft(p,iVar11);
              if (iVar10 != iVar5) goto LAB_003e769e;
              pVVar4 = p->pDesign->vHash->vObjs;
              if (pVVar4->nSize <= (int)uVar6) goto LAB_003e759d;
              iVar10 = pVVar4->pArray[(ulong)uVar6 + 1];
            }
            iVar11 = Cba_FonRight(p,iVar11);
            uVar22 = extraout_RDX_21;
            if (iVar10 != iVar11) {
              __assert_fail("Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x846,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (pNtk->vOutputs).nSize);
    }
    return 0;
  }
  pVVar4 = &p->vObjFunc;
  lVar18 = 0;
  do {
    piVar19 = (pNtk->vObjs).pArray;
    iVar10 = piVar19[lVar18];
    if (((long)iVar10 < 0) || (uVar6 = (pNtk->vBoxes).nSize, (int)uVar6 <= iVar10))
    goto LAB_003e73d6;
    piVar2 = (pNtk->vBoxes).pArray;
    Prs_BoxSignals_V._0_4_ = piVar2[iVar10] + -2;
    uVar8 = piVar19[lVar18];
    lVar28 = (long)(int)uVar8;
    Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
    if ((lVar28 < -3) || (uVar6 <= uVar8 + 3)) goto LAB_003e759d;
    Prs_BoxSignals_V._8_8_ = piVar2 + (uVar8 + 3);
    if ((pNtk->vObjs).nSize <= lVar18) goto LAB_003e73d6;
    if (*(int *)Prs_BoxSignals_V._8_8_ == 0) {
      if (((int)uVar8 < -1) || (uVar6 <= uVar8)) goto LAB_003e73d6;
      local_b0._0_4_ =
           Cba_ObjAlloc(p,piVar2[lVar28 + 1],
                        ((piVar2[lVar28] - (piVar2[lVar28] + -2 >> 0x1f)) + -2 >> 1) + -1,
                        (piVar2[lVar28 + 1] == CBA_BOX_ADD) + 1);
      if ((int)(uint)local_b0 < 1) {
LAB_003e7490:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFon0).nSize <= (int)(uint)local_b0) || ((int)Prs_BoxSignals_V._4_4_ < 2))
      goto LAB_003e73d6;
      Prs_CreateSignalOut(p,(p->vObjFon0).pArray[(uint)local_b0],pNtk,
                          *(int *)(Prs_BoxSignals_V._8_8_ + 4));
LAB_003e61e2:
      if (local_48 <= lVar18) goto LAB_003e73f5;
      *(uint *)((long)local_90 + lVar18 * 4) = (uint)local_b0;
      if ((((pNtk->vObjs).nSize <= lVar18) || (iVar10 = (pNtk->vObjs).pArray[lVar18], iVar10 < -2))
         || (uVar6 = iVar10 + 2, (pNtk->vBoxes).nSize <= (int)uVar6)) goto LAB_003e73d6;
      iVar10 = (pNtk->vBoxes).pArray[uVar6];
      if (iVar10 != 0) {
        Cba_ObjSetName(p,(uint)local_b0,iVar10);
      }
    }
    else {
      if ((int)uVar8 < -1) goto LAB_003e73d6;
      pcVar16 = Abc_NamStr(pNtk->pStrs,piVar2[lVar28 + 1]);
      iVar10 = strncmp(pcVar16,"VERIFIC_PWR",0xb);
      pPVar29 = s_VerInfo + 1;
      if (iVar10 != 0) {
        lVar28 = 0;
        do {
          lVar23 = lVar28;
          if (lVar23 + 0x40 == 0x1440) goto LAB_003e5ccd;
          pcVar3 = *(char **)((long)s_VerInfo[2].pSigNames + lVar23 + -8);
          sVar17 = strlen(pcVar3);
          iVar10 = strncmp(pcVar16,pcVar3,(long)(int)sVar17);
          lVar28 = lVar23 + 0x40;
        } while (iVar10 != 0);
        pPVar29 = (Prs_VerInfo_t *)((long)s_VerInfo[2].pSigNames + lVar23 + -0x10);
      }
      iVar10 = pPVar29->nInputs;
      lVar28 = (long)iVar10;
      CVar24 = pPVar29->Type;
      if (0x2e < (int)CVar24) {
        uVar6 = 2;
        if (CVar24 != CBA_BOX_ADD) {
          if (CVar24 == CBA_BOX_RAMWC) goto LAB_003e6244;
          if (CVar24 != CBA_BOX_DFFCPL) goto LAB_003e5efb;
        }
LAB_003e5fe6:
        uVar8 = Cba_ObjAlloc(p,CVar24,iVar10,uVar6);
        local_b0 = (ulong)uVar8;
        pCVar1 = p->pDesign;
        if (0 < (pCVar1->vUsed2).nSize) {
          piVar19 = (pCVar1->vUsed2).pArray;
          lVar23 = 0;
          do {
            iVar10 = piVar19[lVar23];
            if (((long)iVar10 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73f5;
            (pCVar1->vNameMap2).pArray[iVar10] = 0;
            lVar23 = lVar23 + 1;
          } while (lVar23 < (pCVar1->vUsed2).nSize);
        }
        (pCVar1->vUsed2).nSize = 0;
        uVar25 = 0;
        do {
          uVar8 = Abc_NamStrFind(p->pDesign->pStrs,pPVar29->pSigNames[uVar25 + lVar28]);
          pCVar1 = p->pDesign;
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar8 + 1,Fill_10);
          if (((int)uVar8 < 0) || ((pCVar1->vNameMap2).nSize <= (int)uVar8)) goto LAB_003e73d6;
          if ((pCVar1->vNameMap2).pArray[uVar8] != 0) goto LAB_003e7452;
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar8 + 1,Fill_11);
          if ((pCVar1->vNameMap2).nSize <= (int)uVar8) goto LAB_003e73f5;
          uVar15 = uVar25 + 1;
          (pCVar1->vNameMap2).pArray[uVar8] = (int)uVar25 + 1;
          Vec_IntPush(&pCVar1->vUsed2,uVar8);
          lVar23 = extraout_RDX_07;
          uVar25 = uVar15;
        } while (uVar6 != uVar15);
LAB_003e60fb:
        if (1 < (int)Prs_BoxSignals_V._4_4_) {
          lVar28 = 1;
          do {
            iVar10 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar28 * 4);
            lVar27 = (long)iVar10;
            iVar11 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar28 * 4);
            pCVar1 = p->pDesign;
            Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)lVar23);
            if ((lVar27 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73d6;
            lVar23 = extraout_RDX_08;
            if ((pCVar1->vNameMap2).pArray[lVar27] != 0) {
              pCVar1 = p->pDesign;
              Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)extraout_RDX_08);
              if ((pCVar1->vNameMap2).nSize <= iVar10) goto LAB_003e73d6;
              if ((int)(uint)local_b0 < 1) {
                __assert_fail("i>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                              ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
              }
              if ((p->vObjFon0).nSize <= (int)(uint)local_b0) goto LAB_003e73d6;
              Prs_CreateSignalOut(p,(pCVar1->vNameMap2).pArray[lVar27] + -1 +
                                    (p->vObjFon0).pArray[local_b0],pNtk,iVar11);
              lVar23 = extraout_RDX_09;
            }
            lVar28 = lVar28 + 2;
          } while ((int)lVar28 < (int)Prs_BoxSignals_V._4_4_);
        }
        goto LAB_003e61e2;
      }
      if (CVar24 != CBA_OBJ_BOX) {
        if (CVar24 == CBA_BOX_NMUX) {
          iVar10 = strncmp(pcVar16,"wide_mux_",9);
          if (iVar10 == 0) {
            pcVar16 = pcVar16 + 9;
          }
          else {
            iVar10 = strncmp(pcVar16,"Mux_",4);
            if (iVar10 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x777,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            pcVar16 = pcVar16 + 4;
          }
          iVar10 = atoi(pcVar16);
          uVar6 = 1;
          iVar10 = (1 << ((byte)iVar10 & 0x1f)) + 1;
          CVar24 = CBA_BOX_NMUX;
        }
        else if (CVar24 == CBA_BOX_SEL) {
          iVar10 = strncmp(pcVar16,"wide_select_",0xc);
          if (iVar10 == 0) {
            pcVar16 = pcVar16 + 0xc;
          }
          else {
            iVar10 = strncmp(pcVar16,"Select_",7);
            if (iVar10 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x77f,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            pcVar16 = pcVar16 + 7;
          }
          iVar10 = atoi(pcVar16);
          iVar10 = iVar10 + 1;
          CVar24 = CBA_BOX_SEL;
          uVar6 = 1;
        }
        else {
LAB_003e5efb:
          uVar6 = 1;
          if ((((CVar24 == CBA_BOX_DFFRS) || (CVar24 == CBA_BOX_LATCHRS)) &&
              (iVar11 = strncmp(pcVar16,"wide_",5), iVar11 == 0)) &&
             (iVar11 = Prs_CreateFlopSetReset
                                 (p,pNtk,(Vec_Int_t *)Prs_BoxSignals_V,(int *)0x0,(int *)0x0,
                                  (int *)0x0,(int *)0x0), iVar11 == 0)) {
            iVar10 = atoi(pcVar16 + (ulong)(CVar24 != CBA_BOX_DFFRS) * 2 + 0xb);
            CVar24 = CBA_BOX_CONCAT;
          }
        }
        goto LAB_003e5fe6;
      }
LAB_003e5ccd:
      pCVar1 = p->pDesign;
      uVar6 = Abc_NamStrFind(pCVar1->pMods,pcVar16);
      if (((0 < (int)uVar6) && ((int)uVar6 < (pCVar1->vNtks).nSize)) &&
         (pvVar26 = (pCVar1->vNtks).pArray[uVar6], pvVar26 != (void *)0x0)) {
        uVar6 = Cba_ObjAlloc(p,CBA_OBJ_BOX,*(int *)((long)pvVar26 + 0x1c),
                             *(int *)((long)pvVar26 + 0x2c));
        if ((int)uVar6 < 1) {
          pcVar16 = "i>0";
LAB_003e7822:
          __assert_fail(pcVar16,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xef,"int Cba_ObjFunc(Cba_Ntk_t *, int)");
        }
        if ((p->vObjFunc).nSize < 1) {
          pcVar16 = "Cba_NtkHasObjFuncs(p)";
          goto LAB_003e7822;
        }
        local_b0 = (ulong)uVar6;
        iVar10 = *(int *)((long)pvVar26 + 8);
        Vec_IntFillExtra(pVVar4,uVar6 + 1,Fill_06);
        if ((int)uVar6 < (p->vObjFunc).nSize) {
          if ((p->vObjFunc).pArray[local_b0] != 0) {
            __assert_fail("Cba_ObjFunc(p, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xf8,"void Cba_ObjSetFunc(Cba_Ntk_t *, int, int)");
          }
          Vec_IntFillExtra(pVVar4,uVar6 + 1,Fill_07);
          if ((int)uVar6 < (p->vObjFunc).nSize) {
            (p->vObjFunc).pArray[local_b0] = iVar10;
            pCVar1 = p->pDesign;
            lVar23 = extraout_RDX_05;
            if (0 < (pCVar1->vUsed2).nSize) {
              piVar19 = (pCVar1->vUsed2).pArray;
              lVar23 = 0;
              do {
                iVar10 = piVar19[lVar23];
                if (((long)iVar10 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73f5;
                (pCVar1->vNameMap2).pArray[iVar10] = 0;
                lVar23 = lVar23 + 1;
              } while (lVar23 < (pCVar1->vUsed2).nSize);
            }
            (pCVar1->vUsed2).nSize = 0;
            if (0 < *(int *)((long)pvVar26 + 0x2c)) {
              lVar28 = 0;
              do {
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0x30) + lVar28 * 4);
                if ((long)iVar10 < 1) goto LAB_003e7515;
                if (*(int *)((long)pvVar26 + 0xcc) < 1) goto LAB_003e750c;
                Vec_IntFillExtra((Vec_Int_t *)((long)pvVar26 + 200),iVar10 + 1,(int)lVar23);
                if (*(int *)((long)pvVar26 + 0xcc) <= iVar10) goto LAB_003e73d6;
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0xd0) + (long)iVar10 * 4);
                lVar23 = (long)iVar10;
                pCVar1 = p->pDesign;
                Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,Fill_08);
                if ((lVar23 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73d6;
                if ((pCVar1->vNameMap2).pArray[lVar23] != 0) goto LAB_003e7452;
                Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,Fill_09);
                if ((pCVar1->vNameMap2).nSize <= iVar10) goto LAB_003e73f5;
                lVar27 = lVar28 + 1;
                (pCVar1->vNameMap2).pArray[lVar23] = (int)lVar28 + 1;
                Vec_IntPush(&pCVar1->vUsed2,iVar10);
                lVar23 = extraout_RDX_06;
                lVar28 = lVar27;
              } while (lVar27 < *(int *)((long)pvVar26 + 0x2c));
            }
            goto LAB_003e60fb;
          }
          goto LAB_003e73f5;
        }
        goto LAB_003e73d6;
      }
      printf("Fatal error: Cannot find module \"%s\".\n",pcVar16);
    }
LAB_003e6244:
    lVar18 = lVar18 + 1;
    iVar10 = (pNtk->vObjs).nSize;
  } while (lVar18 < iVar10);
  iVar11 = (p->vArray0).nSize;
  if (iVar11 != 0) {
    if (0x55555554 < iVar11 * -0x55555555 + 0x2aaaaaaaU) {
      __assert_fail("Vec_IntSize(p) % nMulti == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x572,"void Vec_IntSortMulti(Vec_Int_t *, int, int)");
    }
    qsort((p->vArray0).pArray,(long)(iVar11 / 3),0xc,Vec_IntSortCompare1);
    iVar10 = (p->vArray0).nSize;
    iVar11 = 0;
    lVar18 = 0;
    if (2 < iVar10) {
      lVar18 = 0;
      iVar11 = 0;
      iVar5 = -1;
      do {
        piVar19 = (p->vArray0).pArray;
        iVar7 = piVar19[lVar18];
        iVar12 = (int)lVar18;
        if (iVar5 != iVar7 && iVar5 != -1) {
          Prs_CreateOutConcat(p,piVar19 + iVar11,(iVar12 - iVar11) / 3);
          iVar10 = (p->vArray0).nSize;
          iVar11 = iVar12;
        }
        lVar18 = lVar18 + 3;
        iVar5 = iVar7;
      } while (iVar12 + 5 < iVar10);
    }
    Prs_CreateOutConcat(p,(p->vArray0).pArray + iVar11,((int)lVar18 - iVar11) / 3);
    iVar10 = (pNtk->vObjs).nSize;
  }
  if (iVar10 < 1) goto LAB_003e720b;
  local_50 = &p->vFonName;
  local_58 = &p->vFonRange;
  lVar18 = 0;
LAB_003e63c1:
  piVar19 = (pNtk->vObjs).pArray;
  iVar10 = piVar19[lVar18];
  if (((long)iVar10 < 0) || (uVar6 = (pNtk->vBoxes).nSize, (int)uVar6 <= iVar10)) goto LAB_003e73d6;
  piVar2 = (pNtk->vBoxes).pArray;
  Prs_BoxSignals_V._0_4_ = piVar2[iVar10] + -2;
  iVar11 = piVar19[lVar18];
  lVar28 = (long)iVar11;
  Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
  if ((lVar28 < -3) || (uVar6 <= iVar11 + 3U)) goto LAB_003e759d;
  Prs_BoxSignals_V._8_8_ = piVar2 + (iVar11 + 3U);
  if ((piVar14[1] <= lVar18) || ((pNtk->vObjs).nSize <= lVar18)) goto LAB_003e73d6;
  uVar6 = *(uint *)(*(long *)(piVar14 + 2) + lVar18 * 4);
  uVar25 = (ulong)uVar6;
  if (*(int *)Prs_BoxSignals_V._8_8_ == 0) {
    if (iVar11 < -1) goto LAB_003e73d6;
    CVar24 = piVar2[lVar28 + 1];
    if (5 < piVar2[iVar10]) {
      lVar28 = 0;
      do {
        iVar11 = Prs_CreateSignalIn(p,pNtk,*(int *)(Prs_BoxSignals_V._8_8_ + 0xc + lVar28 * 4));
        iVar10 = (int)lVar28;
        if (iVar11 != 0) {
          if ((int)uVar6 < 1) goto LAB_003e7591;
          if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
          iVar5 = (iVar10 + 2U >> 1) - 1;
          piVar19 = (p->vObjFin0).pArray + uVar25;
          uVar8 = iVar5 + *piVar19;
          if (uVar8 == 0 || SCARRY4(iVar5,*piVar19) != (int)uVar8 < 0) goto LAB_003e7414;
          if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e73d6;
          piVar19 = (p->vFinFon).pArray;
          if (piVar19[uVar8] != 0) goto LAB_003e7433;
          piVar19[uVar8] = iVar11;
        }
        lVar28 = lVar28 + 2;
      } while (iVar10 + 5 < (int)Prs_BoxSignals_V._4_4_);
    }
  }
  else {
    if (iVar11 < -1) goto LAB_003e73d6;
    pcVar16 = Abc_NamStr(pNtk->pStrs,piVar2[lVar28 + 1]);
    iVar10 = strncmp(pcVar16,"VERIFIC_PWR",0xb);
    pPVar29 = s_VerInfo + 1;
    piVar19 = extraout_RDX_10;
    if (iVar10 != 0) {
      lVar28 = 0;
      do {
        lVar23 = lVar28;
        if (lVar23 + 0x40 == 0x1440) {
          uVar8 = 0xffffffff;
          CVar24 = CBA_OBJ_BOX;
          ppcVar30 = (char **)0x0;
          goto LAB_003e6666;
        }
        pcVar3 = *(char **)((long)s_VerInfo[2].pSigNames + lVar23 + -8);
        sVar17 = strlen(pcVar3);
        iVar10 = strncmp(pcVar16,pcVar3,(long)(int)sVar17);
        lVar28 = lVar23 + 0x40;
        piVar19 = extraout_RDX_11;
      } while (iVar10 != 0);
      pPVar29 = (Prs_VerInfo_t *)((long)s_VerInfo[2].pSigNames + lVar23 + -0x10);
    }
    CVar24 = pPVar29->Type;
    uVar8 = pPVar29->nInputs;
    ppcVar30 = pPVar29->pSigNames;
    if (((CVar24 == CBA_BOX_DFFRS) || (CVar24 == CBA_BOX_LATCHRS)) &&
       (iVar10 = strncmp(pcVar16,"wide_",5), piVar19 = extraout_RDX_12, iVar10 == 0)) {
      local_5c = -1;
      local_60 = -1;
      local_64 = -1;
      local_68 = 0xffffffff;
      iVar10 = Prs_CreateFlopSetReset
                         (p,pNtk,(Vec_Int_t *)Prs_BoxSignals_V,&local_5c,&local_60,&local_64,
                          (int *)&local_68);
      uVar22 = Prs_BoxSignals_V._8_8_;
      if (iVar10 != 0) {
        if ((-1 < (long)local_5c) && (local_5c < (int)Prs_BoxSignals_V._4_4_)) {
          *(int *)(Prs_BoxSignals_V._8_8_ + (long)local_5c * 4) = local_64;
          if ((-1 < (long)local_60) && (local_60 < (int)Prs_BoxSignals_V._4_4_)) {
            piVar19 = (int *)(ulong)local_68;
            *(uint *)(uVar22 + (long)local_60 * 4) = local_68;
            goto LAB_003e6666;
          }
        }
LAB_003e73f5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      uVar9 = atoi(pcVar16 + (ulong)(CVar24 != CBA_BOX_DFFRS) * 2 + 0xb);
      if ((int)uVar6 < 1) goto LAB_003e76fb;
      if ((p->vObjType).nSize <= (int)uVar6) goto LAB_003e7638;
      if ((p->vObjType).pArray[uVar25] != 'Y') {
        __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_CONCAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if ((int)uVar8 < 0) {
        __assert_fail("nInputs >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      pCVar1 = p->pDesign;
      if (0 < (pCVar1->vUsed2).nSize) {
        piVar19 = (pCVar1->vUsed2).pArray;
        lVar28 = 0;
        do {
          iVar10 = piVar19[lVar28];
          if (((long)iVar10 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73f5;
          (pCVar1->vNameMap2).pArray[iVar10] = 0;
          lVar28 = lVar28 + 1;
        } while (lVar28 < (pCVar1->vUsed2).nSize);
      }
      (pCVar1->vUsed2).nSize = 0;
      if (uVar8 != 0) {
        uVar15 = 0;
        do {
          uVar13 = Abc_NamStrFind(p->pDesign->pStrs,ppcVar30[uVar15]);
          pCVar1 = p->pDesign;
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar13 + 1,Fill_17);
          if (((int)uVar13 < 0) || ((pCVar1->vNameMap2).nSize <= (int)uVar13)) goto LAB_003e73d6;
          if ((pCVar1->vNameMap2).pArray[uVar13] != 0) {
LAB_003e7452:
            __assert_fail("Vec_IntGetEntry(&p->vNameMap2, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x328,"void Cba_ManSetMap2(Cba_Man_t *, int, int)");
          }
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar13 + 1,Fill_18);
          if ((pCVar1->vNameMap2).nSize <= (int)uVar13) goto LAB_003e73f5;
          uVar21 = uVar15 + 1;
          (pCVar1->vNameMap2).pArray[uVar13] = (int)uVar15 + 1;
          Vec_IntPush(&pCVar1->vUsed2,uVar13);
          uVar15 = uVar21;
        } while (uVar8 != uVar21);
      }
      if (0 < (int)uVar9) {
        uVar15 = 0;
        do {
          uVar8 = Cba_ObjAlloc(p,CVar24,4,1);
          if ((((pNtk->vObjs).nSize <= lVar18) ||
              (iVar10 = (pNtk->vObjs).pArray[lVar18], iVar10 < -2)) ||
             (uVar13 = iVar10 + 2, (pNtk->vBoxes).nSize <= (int)uVar13)) goto LAB_003e73d6;
          iVar10 = (pNtk->vBoxes).pArray[uVar13];
          pPVar20 = pNtk;
          if (iVar10 != 0) {
            pcVar16 = Abc_NamStr(pNtk->pStrs,iVar10);
            iVar10 = Cba_NtkNewStrId(p,"%s[%d]",pcVar16,uVar15);
            Cba_ObjSetName(p,uVar8,iVar10);
            pPVar20 = extraout_RDX_17;
          }
          if ((int)uVar8 < 1) goto LAB_003e7490;
          iVar10 = (p->vObjFon0).nSize;
          if ((iVar10 <= (int)uVar8) || (iVar10 <= (int)uVar6)) goto LAB_003e73d6;
          if ((p->vFonName).nSize < 1) {
            pcVar16 = "Cba_NtkHasFonNames(p)";
LAB_003e7667:
            __assert_fail(pcVar16,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
          }
          piVar19 = (p->vObjFon0).pArray;
          uVar13 = piVar19[uVar25];
          if ((int)uVar13 < 1) {
            pcVar16 = "Cba_FonIsReal(f)";
            goto LAB_003e7667;
          }
          iVar10 = piVar19[uVar8];
          Vec_IntFillExtra(local_50,uVar13 + 1,(int)pPVar20);
          if ((p->vFonName).nSize <= (int)uVar13) goto LAB_003e73d6;
          pcVar16 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar13]);
          iVar11 = Cba_NtkNewStrId(p,"%s[%d]",pcVar16,uVar15);
          Cba_FonSetName(p,iVar10,iVar11);
          if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
          iVar11 = ~(uint)uVar15 + uVar9;
          piVar19 = (p->vObjFin0).pArray + uVar25;
          uVar13 = iVar11 + *piVar19;
          if (uVar13 == 0 || SCARRY4(iVar11,*piVar19) != (int)uVar13 < 0) goto LAB_003e7414;
          if ((p->vFinFon).nSize <= (int)uVar13) goto LAB_003e73d6;
          piVar19 = (p->vFinFon).pArray;
          if (piVar19[uVar13] != 0) goto LAB_003e7433;
          piVar19[uVar13] = iVar10;
          if (1 < (int)Prs_BoxSignals_V._4_4_) {
            lVar28 = 1;
            uVar21 = uVar25;
            do {
              iVar10 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar28 * 4);
              lVar23 = (long)iVar10;
              iVar11 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar28 * 4);
              pCVar1 = p->pDesign;
              Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)uVar21);
              if ((lVar23 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73d6;
              uVar21 = extraout_RDX_18;
              if ((pCVar1->vNameMap2).pArray[lVar23] != 0) {
                pCVar1 = p->pDesign;
                Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)extraout_RDX_18);
                if ((pCVar1->vNameMap2).nSize <= iVar10) goto LAB_003e73d6;
                iVar10 = (pCVar1->vNameMap2).pArray[lVar23];
                iVar11 = Prs_CreateSignalIn(p,pNtk,iVar11);
                if (iVar11 == 0) {
                  __assert_fail("iFon",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x7eb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
                }
                if (iVar10 < 4) {
                  iVar11 = Prs_CreateSlice(p,iVar11,pNtk_01,0);
                }
                if ((p->vObjFin0).nSize <= (int)uVar8) goto LAB_003e73d6;
                iVar10 = iVar10 + -1;
                piVar19 = (p->vObjFin0).pArray + uVar8;
                uVar13 = iVar10 + *piVar19;
                if (uVar13 == 0 || SCARRY4(iVar10,*piVar19) != (int)uVar13 < 0) goto LAB_003e7414;
                if ((p->vFinFon).nSize <= (int)uVar13) goto LAB_003e73d6;
                piVar19 = (p->vFinFon).pArray;
                uVar21 = (ulong)uVar13;
                if (piVar19[uVar21] != 0) goto LAB_003e7433;
                piVar19[uVar21] = iVar11;
              }
              lVar28 = lVar28 + 2;
            } while ((int)lVar28 < (int)Prs_BoxSignals_V._4_4_);
          }
          uVar8 = (uint)uVar15 + 1;
          uVar15 = (ulong)uVar8;
        } while (uVar8 != uVar9);
      }
      goto LAB_003e71e3;
    }
LAB_003e6666:
    if ((int)uVar6 < 1) {
LAB_003e76fb:
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
    }
    if ((p->vObjType).nSize <= (int)uVar6) {
LAB_003e7638:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    pcVar16 = (p->vObjType).pArray;
    if (CVar24 != (byte)pcVar16[uVar25]) {
      __assert_fail("Type == Cba_ObjType(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x7f5,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
    }
    pCVar1 = p->pDesign;
    if (0 < (pCVar1->vUsed2).nSize) {
      piVar19 = (pCVar1->vUsed2).pArray;
      lVar28 = 0;
      do {
        iVar10 = piVar19[lVar28];
        if (((long)iVar10 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73f5;
        (pCVar1->vNameMap2).pArray[iVar10] = 0;
        lVar28 = lVar28 + 1;
      } while (lVar28 < (pCVar1->vUsed2).nSize);
    }
    (pCVar1->vUsed2).nSize = 0;
    if (CVar24 == CBA_OBJ_BOX) {
      if ((p->vObjType).nSize <= (int)uVar6) goto LAB_003e7638;
      if ((pcVar16[uVar25] == '\x03') && (0 < (p->vObjFunc).nSize)) {
        Vec_IntFillExtra(pVVar4,uVar6 + 1,(int)piVar19);
        if ((p->vObjFunc).nSize <= (int)uVar6) goto LAB_003e73d6;
        iVar10 = (p->vObjFunc).pArray[uVar25];
        if (((long)iVar10 < 1) || ((p->pDesign->vNtks).nSize <= iVar10)) goto LAB_003e6811;
        pvVar26 = (p->pDesign->vNtks).pArray[iVar10];
      }
      else {
LAB_003e6811:
        pvVar26 = (void *)0x0;
      }
      if ((p->vObjFin0).nSize <= (int)(uVar6 + 1)) goto LAB_003e73d6;
      piVar19 = (p->vObjFin0).pArray;
      if (*(int *)((long)pvVar26 + 0x1c) != piVar19[uVar25 + 1] - piVar19[uVar25]) {
        __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7fc,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if ((p->vObjFon0).nSize <= (int)(uVar6 + 1)) goto LAB_003e73d6;
      piVar19 = (p->vObjFon0).pArray;
      uVar8 = piVar19[uVar25 + 1] - piVar19[uVar25];
      piVar19 = (int *)(ulong)uVar8;
      if (*(uint *)((long)pvVar26 + 0x2c) != uVar8) {
        __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7fd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if (0 < *(int *)((long)pvVar26 + 0x1c)) {
        lVar28 = 0;
        do {
          iVar10 = *(int *)(*(long *)((long)pvVar26 + 0x20) + lVar28 * 4);
          if ((long)iVar10 < 1) goto LAB_003e7515;
          if (*(int *)((long)pvVar26 + 0xcc) < 1) goto LAB_003e750c;
          Vec_IntFillExtra((Vec_Int_t *)((long)pvVar26 + 200),iVar10 + 1,(int)piVar19);
          if (*(int *)((long)pvVar26 + 0xcc) <= iVar10) goto LAB_003e73d6;
          iVar10 = *(int *)(*(long *)((long)pvVar26 + 0xd0) + (long)iVar10 * 4);
          lVar23 = (long)iVar10;
          pCVar1 = p->pDesign;
          Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,Fill_14);
          if ((lVar23 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73d6;
          if ((pCVar1->vNameMap2).pArray[lVar23] != 0) goto LAB_003e7452;
          Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,Fill_15);
          if ((pCVar1->vNameMap2).nSize <= iVar10) goto LAB_003e73f5;
          lVar27 = lVar28 + 1;
          (pCVar1->vNameMap2).pArray[lVar23] = (int)lVar28 + 1;
          Vec_IntPush(&pCVar1->vUsed2,iVar10);
          piVar19 = extraout_RDX_14;
          lVar28 = lVar27;
        } while (lVar27 < *(int *)((long)pvVar26 + 0x1c));
      }
    }
    else {
      if ((int)uVar8 < 0) {
        __assert_fail("nInputs >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x803,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if (uVar8 != 0) {
        uVar15 = 0;
        do {
          uVar9 = Abc_NamStrFind(p->pDesign->pStrs,ppcVar30[uVar15]);
          pCVar1 = p->pDesign;
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar9 + 1,Fill_12);
          if (((int)uVar9 < 0) || ((pCVar1->vNameMap2).nSize <= (int)uVar9)) goto LAB_003e73d6;
          if ((pCVar1->vNameMap2).pArray[uVar9] != 0) goto LAB_003e7452;
          Vec_IntFillExtra(&pCVar1->vNameMap2,uVar9 + 1,Fill_13);
          if ((pCVar1->vNameMap2).nSize <= (int)uVar9) goto LAB_003e73f5;
          uVar21 = uVar15 + 1;
          (pCVar1->vNameMap2).pArray[uVar9] = (int)uVar15 + 1;
          Vec_IntPush(&pCVar1->vUsed2,uVar9);
          piVar19 = extraout_RDX_13;
          uVar15 = uVar21;
        } while (uVar8 != uVar21);
      }
    }
    if (1 < (int)Prs_BoxSignals_V._4_4_) {
      lVar28 = 1;
      do {
        iVar10 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar28 * 4);
        lVar23 = (long)iVar10;
        iVar11 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar28 * 4);
        pCVar1 = p->pDesign;
        Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)piVar19);
        if ((lVar23 < 0) || ((pCVar1->vNameMap2).nSize <= iVar10)) goto LAB_003e73d6;
        piVar19 = extraout_RDX_15;
        if ((pCVar1->vNameMap2).pArray[lVar23] != 0) {
          pCVar1 = p->pDesign;
          Vec_IntFillExtra(&pCVar1->vNameMap2,iVar10 + 1,(int)extraout_RDX_15);
          if (((pCVar1->vNameMap2).nSize <= iVar10) || ((p->vObjFin0).nSize <= (int)(uVar6 + 1)))
          goto LAB_003e73d6;
          iVar10 = (pCVar1->vNameMap2).pArray[lVar23];
          piVar19 = (p->vObjFin0).pArray;
          if (piVar19[uVar25 + 1] - piVar19[uVar25] < iVar10) {
            __assert_fail("Index < nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x80d,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar11 = Prs_CreateSignalIn(p,pNtk,iVar11);
          piVar19 = extraout_RDX_16;
          if (iVar11 != 0) {
            if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
            iVar10 = iVar10 + -1;
            piVar19 = (p->vObjFin0).pArray + uVar25;
            uVar8 = iVar10 + *piVar19;
            if (uVar8 == 0 || SCARRY4(iVar10,*piVar19) != (int)uVar8 < 0) goto LAB_003e7414;
            if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e73d6;
            piVar2 = (p->vFinFon).pArray;
            piVar19 = (int *)(ulong)uVar8;
            if (piVar2[(long)piVar19] != 0) goto LAB_003e7433;
            piVar2[(long)piVar19] = iVar11;
          }
        }
        lVar28 = lVar28 + 2;
      } while ((int)lVar28 < (int)Prs_BoxSignals_V._4_4_);
    }
    if ((CVar24 & ~CBA_OBJ_PI) == CBA_BOX_NMUX) {
      if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
      iVar10 = (p->vObjFin0).pArray[uVar25];
      if (iVar10 < 0) goto LAB_003e7414;
      uVar8 = iVar10 + 1;
      if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e73d6;
      uVar8 = (p->vFinFon).pArray[uVar8];
      iVar10 = Cba_FonRangeSize(p,uVar8);
      if ((p->vObjFin0).nSize <= (int)(uVar6 + 1)) goto LAB_003e73d6;
      piVar19 = (p->vObjFin0).pArray;
      iVar11 = piVar19[uVar25];
      iVar7 = piVar19[uVar25 + 1] - iVar11;
      iVar5 = iVar10 / (iVar7 + -1);
      if (iVar7 < 2) {
        __assert_fail("Cba_ObjFinNum(p, iObj) >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x81a,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if ((iVar7 + -1) * iVar5 != iVar10) {
        __assert_fail("Slice * nParts == nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x81b,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if (iVar11 < 0) goto LAB_003e7414;
      if ((p->vFinFon).nSize <= (int)(iVar11 + 1U)) goto LAB_003e73d6;
      piVar19 = (p->vFinFon).pArray;
      uVar15 = (ulong)(iVar11 + 1U);
      if (piVar19[uVar15] == 0) {
        __assert_fail("Cba_ObjFinFon(p, i, k)!= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x102,"void Cba_ObjCleanFinFon(Cba_Ntk_t *, int, int)");
      }
      piVar19[uVar15] = 0;
      if ((int)uVar8 < 0) {
        uVar9 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
        if ((int)uVar9 < 1) {
LAB_003e7591:
          pcVar16 = "i>0";
          goto LAB_003e743a;
        }
        if ((p->vObjFin0).nSize <= (int)uVar9) goto LAB_003e73d6;
        uVar15 = (ulong)uVar9;
        iVar11 = (p->vObjFin0).pArray[uVar15];
        lVar28 = (long)iVar11;
        if (lVar28 < 1) goto LAB_003e7414;
        if ((p->vFinFon).nSize <= iVar11) goto LAB_003e73d6;
        piVar19 = (p->vFinFon).pArray;
        if (piVar19[lVar28] != 0) goto LAB_003e7433;
        piVar19[lVar28] = uVar8;
        if ((p->vObjFon0).nSize <= (int)uVar9) goto LAB_003e73d6;
        uVar8 = (p->vObjFon0).pArray[uVar15];
        iVar11 = Cba_NtkNewStrId(p,"_buf_const_%d",(ulong)uVar9);
        Cba_FonSetName(p,uVar8,iVar11);
        iVar10 = Hash_Int2ManInsert(p->pDesign->vHash,iVar10 + -1,0,(int)uVar15);
        if ((p->vFonRange).nSize < 1) {
LAB_003e74af:
          __assert_fail("Cba_NtkHasFonRanges(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
        }
        if (iVar10 < 0) {
LAB_003e74ce:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntFillExtra(local_58,uVar8 + 1,Fill_16);
        if (((int)uVar8 < 0) || ((p->vFonRange).nSize <= (int)uVar8)) goto LAB_003e73f5;
        (p->vFonRange).pArray[uVar8] = iVar10 * 2;
      }
      iVar10 = 1;
      iVar11 = 0;
      do {
        iVar12 = Hash_Int2ManInsert(p->pDesign->vHash,iVar11 + iVar5 + -1,iVar11,(int)uVar15);
        iVar12 = Prs_CreateSlice(p,uVar8,pNtk_00,iVar12);
        if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
        uVar9 = (p->vObjFin0).pArray[uVar25] + iVar10;
        if ((int)uVar9 < 1) goto LAB_003e7414;
        if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003e73d6;
        piVar19 = (p->vFinFon).pArray;
        uVar15 = (ulong)uVar9;
        if (piVar19[uVar15] != 0) goto LAB_003e7433;
        piVar19[uVar15] = iVar12;
        iVar10 = iVar10 + 1;
        iVar11 = iVar11 + iVar5;
      } while (iVar7 != iVar10);
    }
  }
  if (CVar24 == CBA_BOX_DFFRS) {
    if ((int)uVar6 < 1) {
LAB_003e767f:
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
    }
    iVar10 = (p->vObjFin0).nSize;
    if (iVar10 <= (int)uVar6) goto LAB_003e73d6;
    piVar19 = (p->vObjFin0).pArray;
    iVar11 = piVar19[uVar25];
    if (iVar11 < 0) goto LAB_003e7414;
    uVar8 = iVar11 + 1;
    if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e73d6;
    piVar2 = (p->vFinFon).pArray;
    if (piVar2[uVar8] == 0) {
      piVar2[uVar8] = -2;
      iVar10 = (p->vObjFin0).nSize;
    }
    if (iVar10 <= (int)uVar6) goto LAB_003e73d6;
    iVar10 = piVar19[uVar25];
    if (iVar10 < -1) goto LAB_003e7414;
    uVar6 = iVar10 + 2;
    if ((p->vFinFon).nSize <= (int)uVar6) goto LAB_003e73d6;
    if (piVar2[uVar6] == 0) {
      piVar2[uVar6] = -2;
    }
  }
  else if (CVar24 == CBA_BOX_ADD) {
    if ((int)uVar6 < 1) goto LAB_003e767f;
    if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e73d6;
    iVar10 = (p->vObjFin0).pArray[uVar25];
    lVar28 = (long)iVar10;
    if (lVar28 < 1) goto LAB_003e7414;
    if ((p->vFinFon).nSize <= iVar10) goto LAB_003e73d6;
    piVar19 = (p->vFinFon).pArray;
    if (piVar19[lVar28] == 0) {
      piVar19[lVar28] = -2;
    }
  }
LAB_003e71e3:
  lVar18 = lVar18 + 1;
  if ((pNtk->vObjs).nSize <= lVar18) goto code_r0x003e71f6;
  goto LAB_003e63c1;
code_r0x003e71f6:
  local_90 = *(void **)(piVar14 + 2);
  goto LAB_003e720b;
LAB_003e7515:
  pcVar16 = "i>0";
  goto LAB_003e751c;
LAB_003e750c:
  pcVar16 = "Cba_NtkHasObjNames(p)";
LAB_003e751c:
  __assert_fail(pcVar16,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
}

Assistant:

int Prs_CreateVerilogNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox2Obj = Vec_IntStart( Prs_NtkBoxNum(pNtk) );
    Vec_Int_t * vBox;  Vec_Ptr_t * vAllRams, * vRam;
    int i, k, iObj, iTerm, iFon, FormId, ActId, RangeId, NameId, Type;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );

    // map wire names into their rangeID
    Vec_IntForEachEntryTwo( &pNtk->vWires, &pNtk->vWiresR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );

    // collect RAMs and create boxes
    vAllRams = Prs_CreateDetectRams( pNtk );
    if ( vAllRams )
    Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, i )
    {
        char * pRamName = (char *)Vec_PtrEntry( vRam, 0 );
        int MemSize = Abc_Ptr2Int( (char *)Vec_PtrEntry( vRam, 1 ) );
        //char Buffer[1000]; sprintf( Buffer, "%s_box", pRamName );
        //NameId = Cba_NtkNewStrId( p, Buffer ); 
        NameId = Cba_NtkNewStrId( p, "%s_box", pRamName );
        // create RAM object
        iObj = Cba_ObjAlloc( p, CBA_BOX_RAMBOX, Vec_PtrSize(vRam)-2, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        NameId = Cba_NtkNewStrId( p, pRamName ); 
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        assert( Cba_FonLeft(p, iFon) <= MemSize-1 );
        assert( Cba_FonRight(p, iFon) == 0 );
        //Cba_VerificSaveLineFile( p, iObj, pNet->Linefile() );
        // create write ports feeding into this object
        Vec_PtrForEachEntryStart( Vec_Int_t *, vRam, vBox, k, 2 )
        {
            int iObjNew = Cba_ObjAlloc( p, CBA_BOX_RAMWC, 4, 1 );
            int Line = Vec_IntPop( vBox );
            Vec_IntWriteEntry( vBox2Obj, Line, iObjNew );
            if ( Prs_BoxName(pNtk, Line) )
                Cba_ObjSetName( p, iObjNew, Prs_BoxName(pNtk, Line) );
            //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
            // connect output
            iFon = Cba_ObjFon0(p, iObjNew);
            Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, MemSize-1, 0) );
            //sprintf( Buffer, "%s_wp%d", pRamName, k-2 );
            //NameId = Cba_NtkNewStrId( p, Buffer ); 
            NameId = Cba_NtkNewStrId( p, "%s_wp%d", pRamName, k-2 );
            Cba_FonSetName( p, iFon, NameId );
            Cba_NtkSetMap( p, NameId, iFon );
            // connet to RAM object
            Cba_ObjSetFinFon( p, iObj, (k++)-2, iFon );
            Vec_IntFree( vBox );
        }
        Vec_PtrFree( vRam );
    }
    Vec_PtrFreeP( &vAllRams );

    // create objects
    Vec_IntClear( &p->vArray0 );
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, Prs_BoxIONum(pNtk, i)-1, Type == CBA_BOX_ADD ? 2 : 1 );
            Prs_CreateSignalOut( p, Cba_ObjFon0(p, iObj), pNtk, Vec_IntEntry(vBox, 1) ); // node output
        }
        else // box
        {
            Cba_Ntk_t * pBox = NULL; int nInputs, nOutputs = 1;
            char ** pOutNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 1, &pOutNames );
            if ( Type == CBA_BOX_RAMWC )
                continue;
            if ( Type == CBA_OBJ_BOX )
            {
                pBox = Cba_ManNtkFind( p->pDesign, pNtkName );
                if ( pBox == NULL )
                {
                    printf( "Fatal error: Cannot find module \"%s\".\n", pNtkName );
                    continue;
                }
                nInputs = Cba_NtkPiNum(pBox);
                nOutputs = Cba_NtkPoNum(pBox);
            }
            else if ( Type == CBA_BOX_ADD || Type == CBA_BOX_DFFCPL )
                nOutputs = 2;
            else if ( Type == CBA_BOX_NMUX )
            {
                if ( !strncmp(pNtkName, "wide_mux_", strlen("wide_mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("wide_mux_")));
                else if ( !strncmp(pNtkName, "Mux_", strlen("Mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("Mux_")));
                else assert( 0 );
            }
            else if ( Type == CBA_BOX_SEL )
            {
                if ( !strncmp(pNtkName, "wide_select_", strlen("wide_select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("wide_select_"));
                else if ( !strncmp(pNtkName, "Select_", strlen("Select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("Select_"));
                else assert( 0 );
            }
            else if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) && !Prs_CreateFlopSetReset(p, pNtk, vBox, NULL, NULL, NULL, NULL) )
                nInputs = atoi(pNtkName+strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_")), nOutputs = 1, Type = CBA_BOX_CONCAT;
            // create object
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, nInputs, nOutputs );
            if ( pBox ) Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            if ( pBox )
                Cba_NtkForEachPo( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            else
                for ( k = 0; k < nOutputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pOutNames[k]), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Prs_CreateSignalOut( p, iFon, pNtk, ActId );
                }
        }
        Vec_IntWriteEntry( vBox2Obj, i, iObj );
        if ( Prs_BoxName(pNtk, i) )
            Cba_ObjSetName( p, iObj, Prs_BoxName(pNtk, i) );
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // create concatenations for split signals
    if ( Vec_IntSize(&p->vArray0) )
    {
        int Prev = -1, Index = 0;
        Vec_IntSortMulti( &p->vArray0, 3, 0 );
        Vec_IntForEachEntryTriple( &p->vArray0, NameId, RangeId, iFon, i )
        {
            if ( Prev != -1 && Prev != NameId )
                Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
            Prev = NameId;         
        }
        Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Obj, i );
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            Vec_IntForEachEntryDoubleStart( vBox, FormId, ActId, k, 2 )
            {
                iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2-1, iFon ); 
            }
        }
        else // box
        {
            int nInputs = -1;
            char ** pInNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 0, &pInNames );
            if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) )
            {
                int IndexSet = -1, IndexRst = -1,  iBitSet = -1, iBitRst = -1;
                int Status = Prs_CreateFlopSetReset( p, pNtk, vBox, &IndexSet, &IndexRst, &iBitSet, &iBitRst );
                if ( Status )
                {
                    Vec_IntWriteEntry( vBox, IndexSet, iBitSet );
                    Vec_IntWriteEntry( vBox, IndexRst, iBitRst );
                    // updated box should be fine
                }
                else
                {
                    int w, Width = atoi( pNtkName + strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_") );
                    assert( Cba_ObjType(p, iObj) == CBA_BOX_CONCAT );
                    // prepare inputs
                    assert( nInputs >= 0 );
                    Cba_NtkCleanMap2( p );
                    for ( k = 0; k < nInputs; k++ )
                        Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
                    // create bit-level objects
                    for ( w = 0; w < Width; w++ )
                    {
                        // create bit-level flop
                        int iObjNew = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, 4, 1 );
                        if ( Prs_BoxName(pNtk, i) )
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Prs_NtkStr(pNtk, Prs_BoxName(pNtk, i)), w );
                            Cba_ObjSetName( p, iObjNew, NameId );
                        }
                        //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
                        // set output fon
                        iFon = Cba_ObjFon0(p, iObjNew);
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)), w );
                            Cba_FonSetName( p, iFon, NameId );
                        }
                        // no need to map this name because it may be produced elsewhere
                        //Cba_NtkSetMap( p, NameId, iFon );
                        // add the flop
                        Cba_ObjSetFinFon( p, iObj, Width-1-w, iFon );
                        // create bit-level flops
                        Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                            if ( Cba_NtkGetMap2(p, FormId) )
                            {
                                int Index = Cba_NtkGetMap2(p, FormId)-1;
                                iFon = Prs_CreateSignalIn( p, pNtk, ActId );  assert( iFon );
                                // create bit-select node for data/set/reset (but not for clock)
                                if ( Index < 3 ) // not clock
                                    iFon = Prs_CreateSlice( p, iFon, pNtk, 0 );
                                Cba_ObjSetFinFon( p, iObjNew, Index, iFon );
                            }
                    }
                    continue;
                }
            }
            assert( Type == Cba_ObjType(p, iObj) );
            //assert( nInputs == -1 || nInputs == Cba_ObjFinNum(p, iObj) );
            // mark PI objects
            Cba_NtkCleanMap2( p );
            if ( Type == CBA_OBJ_BOX )
            {
                Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
                assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
                assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
                Cba_NtkForEachPi( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            }
            else
            {
                assert( nInputs >= 0 );
                for ( k = 0; k < nInputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
            }
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    int Index = Cba_NtkGetMap2(p, FormId)-1;
                    int nBits = Cba_ObjFinNum(p, iObj);
                    assert( Index < nBits );
                    iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Index, iFon );
                }
            // special cases
            if ( Type == CBA_BOX_NMUX || Type == CBA_BOX_SEL )
            {
                int FonCat = Cba_ObjFinFon( p, iObj, 1 );
                int nBits  = Cba_FonRangeSize( p, FonCat );
                int nParts = Cba_ObjFinNum(p, iObj) - 1;
                int Slice  = nBits / nParts;
                int nFins = Cba_ObjFinNum(p, iObj);
                assert( Cba_ObjFinNum(p, iObj) >= 2 );
                assert( Slice * nParts == nBits );
                assert( nFins == 1 + nParts );
                Cba_ObjCleanFinFon( p, iObj, 1 );
                // create buffer for the constant
                if ( FonCat < 0 ) 
                {
                    int iObjNew = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                    Cba_ObjSetFinFon( p, iObjNew, 0, FonCat );
                    FonCat = Cba_ObjFon0( p, iObjNew );
                    NameId = Cba_NtkNewStrId( p, "_buf_const_%d", iObjNew );
                    Cba_FonSetName( p, FonCat, NameId );
                    Cba_FonSetRange( p, FonCat, Cba_NtkHashRange(p, nBits-1, 0) );
                }
                for ( k = 0; k < nParts; k++ )
                {
//                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, (nParts-1-k)*Slice+Slice-1, (nParts-1-k)*Slice) );
                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, k*Slice+Slice-1, k*Slice) );
                    Cba_ObjSetFinFon( p, iObj, k+1, iFon );
                }
            }
        }
        // if carry-in is not supplied, use constant 0
        if ( Type == CBA_BOX_ADD && Cba_ObjFinFon(p, iObj, 0) == 0 )
            Cba_ObjSetFinFon( p, iObj, 0, Cba_FonFromConst(1) );
        // if set or reset are not supplied, use constant 0
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 1) == 0 )
            Cba_ObjSetFinFon( p, iObj, 1, Cba_FonFromConst(1) );
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 2) == 0 )
            Cba_ObjSetFinFon( p, iObj, 2, Cba_FonFromConst(1) );
    }
    Vec_IntFree( vBox2Obj );
    // connect outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_NtkPo( p, i );
        assert( NameId == Cba_ObjName(p, iObj) ); // direct name
        iFon = Prs_CreateVerilogFindFon( p, NameId );
        if ( !iFon ) 
            continue;
        Cba_ObjSetFinFon( p, iObj, 0, iFon );
        if ( RangeId )
        {
            assert( Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId))  == Cba_FonLeft(p, iFon) );
            assert( Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon) );
        }
    }
    return 0;
}